

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O1

void nifti_mat44_to_orientation(int *icod,int *jcod,int *kcod)

{
  float fVar1;
  float fVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  float *pfVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  bool bVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float in_stack_00000008;
  float in_stack_0000000c;
  float in_stack_00000010;
  float in_stack_00000018;
  float in_stack_0000001c;
  float in_stack_00000020;
  float in_stack_00000028;
  float in_stack_0000002c;
  mat33 P;
  mat33 C;
  float local_110;
  float local_10c;
  float local_108;
  float local_100;
  float local_fc;
  float local_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  float local_c8;
  float local_b8 [6];
  float local_a0 [10];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  float local_58;
  float local_54 [4];
  float local_44;
  float local_34;
  
  if (kcod != (int *)0x0 && (jcod != (int *)0x0 && icod != (int *)0x0)) {
    *kcod = 0;
    *jcod = 0;
    *icod = 0;
    fVar19 = in_stack_00000028 * in_stack_00000028 +
             in_stack_00000008 * in_stack_00000008 + in_stack_00000018 * in_stack_00000018;
    if (fVar19 < 0.0) {
      fVar19 = sqrtf(fVar19);
    }
    else {
      fVar19 = SQRT(fVar19);
    }
    if ((fVar19 != 0.0) || (NAN(fVar19))) {
      local_100 = in_stack_0000002c * in_stack_0000002c +
                  in_stack_0000000c * in_stack_0000000c + in_stack_0000001c * in_stack_0000001c;
      if (local_100 < 0.0) {
        local_ec = fVar19;
        local_100 = sqrtf(local_100);
        fVar19 = local_ec;
      }
      else {
        local_100 = SQRT(local_100);
      }
      if ((local_100 != 0.0) || (NAN(local_100))) {
        fVar21 = in_stack_00000008 / fVar19;
        fVar24 = in_stack_00000018 / fVar19;
        fVar19 = in_stack_00000028 / fVar19;
        fVar22 = in_stack_0000000c / local_100;
        local_fc = in_stack_0000001c / local_100;
        local_100 = in_stack_0000002c / local_100;
        fVar20 = fVar19 * local_100 + fVar21 * fVar22 + fVar24 * local_fc;
        if (0.0001 < ABS(fVar20)) {
          fVar22 = fVar22 - fVar20 * fVar21;
          local_fc = local_fc - fVar20 * fVar24;
          local_100 = local_100 - fVar20 * fVar19;
          fVar20 = local_100 * local_100 + fVar22 * fVar22 + local_fc * local_fc;
          if (fVar20 < 0.0) {
            fVar20 = sqrtf(fVar20);
          }
          else {
            fVar20 = SQRT(fVar20);
          }
          if ((fVar20 == 0.0) && (!NAN(fVar20))) {
            return;
          }
          fVar22 = fVar22 / fVar20;
          local_fc = local_fc / fVar20;
          local_100 = local_100 / fVar20;
        }
        local_110 = P.m[0][0] * P.m[0][0] +
                    in_stack_00000010 * in_stack_00000010 + in_stack_00000020 * in_stack_00000020;
        if (local_110 < 0.0) {
          local_110 = sqrtf(local_110);
        }
        else {
          local_110 = SQRT(local_110);
        }
        if ((local_110 != 0.0) || (NAN(local_110))) {
          local_10c = in_stack_00000010 / local_110;
          local_108 = in_stack_00000020 / local_110;
          local_110 = P.m[0][0] / local_110;
        }
        else {
          local_10c = fVar24 * local_100 - local_fc * fVar19;
          local_108 = fVar19 * fVar22 - fVar21 * local_100;
          local_110 = fVar21 * local_fc - fVar22 * fVar24;
        }
        fVar20 = fVar19 * local_110 + fVar21 * local_10c + fVar24 * local_108;
        if (0.0001 < ABS(fVar20)) {
          local_10c = local_10c - fVar20 * fVar21;
          local_108 = local_108 - fVar20 * fVar24;
          local_110 = local_110 - fVar20 * fVar19;
          fVar20 = local_110 * local_110 + local_10c * local_10c + local_108 * local_108;
          if (fVar20 < 0.0) {
            fVar20 = sqrtf(fVar20);
          }
          else {
            fVar20 = SQRT(fVar20);
          }
          if ((fVar20 == 0.0) && (!NAN(fVar20))) {
            return;
          }
          local_10c = local_10c / fVar20;
          local_108 = local_108 / fVar20;
          local_110 = local_110 / fVar20;
        }
        fVar20 = local_100 * local_110 + fVar22 * local_10c + local_fc * local_108;
        if (0.0001 < ABS(fVar20)) {
          local_10c = local_10c - fVar20 * fVar22;
          local_108 = local_108 - fVar20 * local_fc;
          local_110 = local_110 - fVar20 * local_100;
          fVar20 = local_110 * local_110 + local_10c * local_10c + local_108 * local_108;
          if (fVar20 < 0.0) {
            fVar20 = sqrtf(fVar20);
          }
          else {
            fVar20 = SQRT(fVar20);
          }
          if ((fVar20 == 0.0) && (!NAN(fVar20))) {
            return;
          }
          local_10c = local_10c / fVar20;
          local_108 = local_108 / fVar20;
          local_110 = local_110 / fVar20;
        }
        fVar20 = (fVar22 * fVar19 * local_108 +
                 fVar24 * local_100 * local_10c +
                 ((fVar21 * local_fc * local_110 - fVar21 * local_100 * local_108) -
                 fVar24 * fVar22 * local_110)) - fVar19 * local_fc * local_10c;
        if ((fVar20 != 0.0) || (NAN(fVar20))) {
          iVar16 = 0;
          uVar5 = 2;
          local_ec = 4.2039e-45;
          iVar4 = 1;
          fVar23 = -666.0;
          uVar10 = 1;
          iVar8 = 1;
          iVar11 = 1;
          uVar13 = 1;
          do {
            uVar14 = 1;
            do {
              if (uVar10 != uVar14) {
                uVar15 = 1;
                do {
                  if (uVar14 != uVar15 && uVar10 != uVar15) {
                    local_d8 = 0;
                    uStack_d0 = 0;
                    local_e8 = 0;
                    uStack_e0 = 0;
                    local_c8 = 0.0;
                    iVar16 = -1;
                    do {
                      iVar7 = -1;
                      do {
                        iVar6 = -1;
                        do {
                          (&local_ec)[uVar10] = (float)iVar16;
                          *(float *)((long)&uStack_e0 + uVar14 * 4) = (float)iVar7;
                          *(float *)((long)&local_d8 + uVar15 * 4 + 4) = (float)iVar6;
                          if (0.0 < ((local_e8._4_4_ * (float)uStack_d0 * local_d8._4_4_ +
                                     uStack_e0._4_4_ * uStack_d0._4_4_ * (float)uStack_e0 +
                                     (((float)local_e8 * (float)local_d8 * local_c8 -
                                      (float)local_e8 * uStack_d0._4_4_ * local_d8._4_4_) -
                                     local_e8._4_4_ * uStack_e0._4_4_ * local_c8)) -
                                    (float)local_d8 * (float)uStack_d0 * (float)uStack_e0) * fVar20)
                          {
                            local_b8[0] = fVar21;
                            local_b8[1] = fVar22;
                            local_b8[2] = local_10c;
                            local_b8[3] = fVar24;
                            local_b8[4] = local_fc;
                            local_b8[5] = local_108;
                            local_a0[0] = fVar19;
                            local_a0[1] = local_100;
                            local_a0[2] = local_110;
                            local_78 = local_e8;
                            uStack_70 = uStack_e0;
                            local_68 = local_d8;
                            uStack_60 = uStack_d0;
                            local_58 = local_c8;
                            lVar17 = 0;
                            pfVar12 = local_54;
                            do {
                              fVar25 = *(float *)((long)&local_78 + lVar17 * 0xc);
                              fVar1 = *(float *)((long)&local_78 + lVar17 * 0xc + 4);
                              fVar2 = *(float *)((long)&uStack_70 + lVar17 * 0xc);
                              lVar3 = 0;
                              do {
                                pfVar12[lVar3] =
                                     local_b8[lVar3 + 6] * fVar2 +
                                     local_b8[lVar3] * fVar25 + local_b8[lVar3 + 3] * fVar1;
                                lVar3 = lVar3 + 1;
                              } while (lVar3 != 3);
                              lVar17 = lVar17 + 1;
                              pfVar12 = pfVar12 + 3;
                            } while (lVar17 != 3);
                            fVar25 = local_54[0] + local_44 + local_34;
                            if (fVar23 < fVar25) {
                              uVar13 = uVar10 & 0xffffffff;
                              uVar5 = uVar14 & 0xffffffff;
                              local_ec = (float)uVar15;
                              fVar23 = fVar25;
                              iVar11 = iVar16;
                              iVar8 = iVar7;
                              iVar4 = iVar6;
                            }
                          }
                          bVar18 = iVar6 < 0;
                          iVar6 = iVar6 + 2;
                        } while (bVar18);
                        bVar18 = iVar7 < 0;
                        iVar7 = iVar7 + 2;
                      } while (bVar18);
                      bVar18 = iVar16 < 0;
                      iVar16 = iVar16 + 2;
                    } while (bVar18);
                  }
                  uVar15 = uVar15 + 1;
                } while (uVar15 != 4);
                iVar16 = 4;
              }
              uVar14 = uVar14 + 1;
            } while (uVar14 != 4);
            uVar10 = uVar10 + 1;
          } while (uVar10 != 4);
          uVar9 = iVar11 * (int)uVar13 + 3;
          iVar7 = 4;
          iVar11 = 4;
          if (uVar9 < 7) {
            iVar11 = *(int *)(&DAT_0011436c + (ulong)uVar9 * 4);
          }
          uVar9 = iVar8 * (int)uVar5 + 3;
          if (uVar9 < 7) {
            iVar7 = *(int *)(&DAT_0011436c + (ulong)uVar9 * 4);
          }
          uVar9 = iVar4 * (int)local_ec + 3;
          if ((uVar9 < 7) && ((0x77U >> (uVar9 & 0x1f) & 1) != 0)) {
            iVar16 = *(int *)(&DAT_00114388 + (ulong)uVar9 * 4);
          }
          *icod = iVar11;
          *jcod = iVar7;
          *kcod = iVar16;
        }
      }
    }
  }
  return;
}

Assistant:

void nifti_mat44_to_orientation( mat44 R , int *icod, int *jcod, int *kcod )
{
   float xi,xj,xk , yi,yj,yk , zi,zj,zk , val,detQ,detP ;
   mat33 P , Q , M ;
   int i,j,k=0,p,q,r , ibest,jbest,kbest,pbest,qbest,rbest ;
   float vbest ;

   if( icod == NULL || jcod == NULL || kcod == NULL ) return ; /* bad */

   *icod = *jcod = *kcod = 0 ; /* error returns, if sh*t happens */

   /* load column vectors for each (i,j,k) direction from matrix */

   /*-- i axis --*/ /*-- j axis --*/ /*-- k axis --*/

   xi = R.m[0][0] ; xj = R.m[0][1] ; xk = R.m[0][2] ;
   yi = R.m[1][0] ; yj = R.m[1][1] ; yk = R.m[1][2] ;
   zi = R.m[2][0] ; zj = R.m[2][1] ; zk = R.m[2][2] ;

   /* normalize column vectors to get unit vectors along each ijk-axis */

   /* normalize i axis */

   val = (float)sqrt( xi*xi + yi*yi + zi*zi ) ;
   if( val == 0.0 ) return ;                 /* stupid input */
   xi /= val ; yi /= val ; zi /= val ;

   /* normalize j axis */

   val = (float)sqrt( xj*xj + yj*yj + zj*zj ) ;
   if( val == 0.0 ) return ;                 /* stupid input */
   xj /= val ; yj /= val ; zj /= val ;

   /* orthogonalize j axis to i axis, if needed */

   val = xi*xj + yi*yj + zi*zj ;    /* dot product between i and j */
   if( fabs(val) > 1.e-4 ){
     xj -= val*xi ; yj -= val*yi ; zj -= val*zi ;
     val = (float)sqrt( xj*xj + yj*yj + zj*zj ) ;  /* must renormalize */
     if( val == 0.0 ) return ;              /* j was parallel to i? */
     xj /= val ; yj /= val ; zj /= val ;
   }

   /* normalize k axis; if it is zero, make it the cross product i x j */

   val = (float)sqrt( xk*xk + yk*yk + zk*zk ) ;
   if( val == 0.0 ){ xk = yi*zj-zi*yj; yk = zi*xj-zj*xi ; zk=xi*yj-yi*xj ; }
   else            { xk /= val ; yk /= val ; zk /= val ; }

   /* orthogonalize k to i */

   val = xi*xk + yi*yk + zi*zk ;    /* dot product between i and k */
   if( fabs(val) > 1.e-4 ){
     xk -= val*xi ; yk -= val*yi ; zk -= val*zi ;
     val = (float)sqrt( xk*xk + yk*yk + zk*zk ) ;
     if( val == 0.0 ) return ;      /* bad */
     xk /= val ; yk /= val ; zk /= val ;
   }

   /* orthogonalize k to j */

   val = xj*xk + yj*yk + zj*zk ;    /* dot product between j and k */
   if( fabs(val) > 1.e-4 ){
     xk -= val*xj ; yk -= val*yj ; zk -= val*zj ;
     val = (float)sqrt( xk*xk + yk*yk + zk*zk ) ;
     if( val == 0.0 ) return ;      /* bad */
     xk /= val ; yk /= val ; zk /= val ;
   }

   Q.m[0][0] = xi ; Q.m[0][1] = xj ; Q.m[0][2] = xk ;
   Q.m[1][0] = yi ; Q.m[1][1] = yj ; Q.m[1][2] = yk ;
   Q.m[2][0] = zi ; Q.m[2][1] = zj ; Q.m[2][2] = zk ;

   /* at this point, Q is the rotation matrix from the (i,j,k) to (x,y,z) axes */

   detQ = nifti_mat33_determ( Q ) ;
   if( detQ == 0.0 ) return ; /* shouldn't happen unless user is a DUFIS */

   /* Build and test all possible +1/-1 coordinate permutation matrices P;
      then find the P such that the rotation matrix M=PQ is closest to the
      identity, in the sense of M having the smallest total rotation angle. */

   /* Despite the formidable looking 6 nested loops, there are
      only 3*3*3*2*2*2 = 216 passes, which will run very quickly. */

   vbest = -666.0f ; ibest=pbest=qbest=rbest=1 ; jbest=2 ; kbest=3 ;
   for( i=1 ; i <= 3 ; i++ ){     /* i = column number to use for row #1 */
    for( j=1 ; j <= 3 ; j++ ){    /* j = column number to use for row #2 */
     if( i == j ) continue ;
      for( k=1 ; k <= 3 ; k++ ){  /* k = column number to use for row #3 */
       if( i == k || j == k ) continue ;
       P.m[0][0] = P.m[0][1] = P.m[0][2] =
        P.m[1][0] = P.m[1][1] = P.m[1][2] =
         P.m[2][0] = P.m[2][1] = P.m[2][2] = 0.0f ;
       for( p=-1 ; p <= 1 ; p+=2 ){    /* p,q,r are -1 or +1      */
        for( q=-1 ; q <= 1 ; q+=2 ){   /* and go into rows #1,2,3 */
         for( r=-1 ; r <= 1 ; r+=2 ){
           P.m[0][i-1] = p ; P.m[1][j-1] = q ; P.m[2][k-1] = r ;
           detP = nifti_mat33_determ(P) ;           /* sign of permutation */
           if( detP * detQ <= 0.0 ) continue ;  /* doesn't match sign of Q */
           M = nifti_mat33_mul(P,Q) ;

           /* angle of M rotation = 2.0*acos(0.5*sqrt(1.0+trace(M)))       */
           /* we want largest trace(M) == smallest angle == M nearest to I */

           val = M.m[0][0] + M.m[1][1] + M.m[2][2] ; /* trace */
           if( val > vbest ){
             vbest = val ;
             ibest = i ; jbest = j ; kbest = k ;
             pbest = p ; qbest = q ; rbest = r ;
           }
   }}}}}}

   /* At this point ibest is 1 or 2 or 3; pbest is -1 or +1; etc.

      The matrix P that corresponds is the best permutation approximation
      to Q-inverse; that is, P (approximately) takes (x,y,z) coordinates
      to the (i,j,k) axes.

      For example, the first row of P (which contains pbest in column ibest)
      determines the way the i axis points relative to the anatomical
      (x,y,z) axes.  If ibest is 2, then the i axis is along the y axis,
      which is direction P2A (if pbest > 0) or A2P (if pbest < 0).

      So, using ibest and pbest, we can assign the output code for
      the i axis.  Mutatis mutandis for the j and k axes, of course. */

   switch( ibest*pbest ){
     case  1: i = NIFTI_L2R ; break ;
     case -1: i = NIFTI_R2L ; break ;
     case  2: i = NIFTI_P2A ; break ;
     case -2: i = NIFTI_A2P ; break ;
     case  3: i = NIFTI_I2S ; break ;
     case -3: i = NIFTI_S2I ; break ;
   }

   switch( jbest*qbest ){
     case  1: j = NIFTI_L2R ; break ;
     case -1: j = NIFTI_R2L ; break ;
     case  2: j = NIFTI_P2A ; break ;
     case -2: j = NIFTI_A2P ; break ;
     case  3: j = NIFTI_I2S ; break ;
     case -3: j = NIFTI_S2I ; break ;
   }

   switch( kbest*rbest ){
     case  1: k = NIFTI_L2R ; break ;
     case -1: k = NIFTI_R2L ; break ;
     case  2: k = NIFTI_P2A ; break ;
     case -2: k = NIFTI_A2P ; break ;
     case  3: k = NIFTI_I2S ; break ;
     case -3: k = NIFTI_S2I ; break ;
   }

   *icod = i ; *jcod = j ; *kcod = k ; return ;
}